

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

void __thiscall libchars::command_node::dump(command_node *this,size_t level)

{
  int iVar1;
  debug *pdVar2;
  command_node *this_00;
  double extraout_XMM0_Qa;
  double __x;
  long *local_50 [2];
  long local_40 [2];
  
  pdVar2 = debug::initialize(0);
  if (2 < pdVar2->log_level) {
    if ((dump(unsigned_long)::indent_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(), iVar1 != 0)) {
      dump(unsigned_long)::indent_abi_cxx11_._M_dataplus._M_p =
           (pointer)&dump(unsigned_long)::indent_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&dump(unsigned_long)::indent_abi_cxx11_,
                 "                                     ","");
      __cxa_atexit(std::__cxx11::string::~string,&dump(unsigned_long)::indent_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release();
    }
    pdVar2 = debug::initialize(0);
    __x = extraout_XMM0_Qa;
    if (level != 0) {
      __x = (double)std::__cxx11::string::substr((ulong)local_50,0x11b898);
    }
    debug::log(pdVar2,__x);
    if ((level != 0) && (local_50[0] != local_40)) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (this->start != (command_node *)0x0) {
      dump(this->start,level + 1);
    }
    for (this_00 = this->head; this_00 != (command_node *)0x0; this_00 = this_00->next) {
      dump(this_00,level + 1);
    }
  }
  return;
}

Assistant:

void command_node::dump(size_t level)
    {
        if (LC_LOG_CHECK_LEVEL(debug::DEBUG)) {
            static std::string indent = "                                     ";
            LC_LOG_DEBUG("%s%s[%p/0x%08x/%s/%p]%s",
                level>0?indent.substr(0,level*2).c_str():"",
                part.empty()?"--ROOT--":part.c_str(),
                this,mask,hidden?"HIDDEN":"VISIBLE",cmd,
                start!=NULL?"==>":"");

            ++level;

            if (start != NULL)
                start->dump(level);

            command_node *n = head;
            while (n != NULL) {
                n->dump(level);
                n = n->next;
            }
        }
    }